

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFunctions.h
# Opt level: O0

int luabridge::detail::CFunc::Call<unsigned_int_(*)(unsigned_int)>::f(lua_State *L)

{
  int iVar1;
  _func_uint_uint *local_18;
  _func_uint_uint *fnptr;
  lua_State *L_local;
  
  fnptr = (_func_uint_uint *)L;
  iVar1 = lua_type(L,-0xf4629);
  if (iVar1 != 2) {
    __assert_fail("lua_islightuserdata(L, lua_upvalueindex(1))",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                  ,0xf8,
                  "static int luabridge::detail::CFunc::Call<unsigned int (*)(unsigned int)>::f(lua_State *) [FnPtr = unsigned int (*)(unsigned int)]"
                 );
  }
  local_18 = (_func_uint_uint *)lua_touserdata((lua_State *)fnptr,-0xf4629);
  if (local_18 != (_func_uint_uint *)0x0) {
    iVar1 = Invoke<unsigned_int,luabridge::detail::TypeList<unsigned_int,void>,1>::
            run<unsigned_int(*)(unsigned_int)>((lua_State *)fnptr,&local_18);
    return iVar1;
  }
  __assert_fail("fnptr != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                ,0xfa,
                "static int luabridge::detail::CFunc::Call<unsigned int (*)(unsigned int)>::f(lua_State *) [FnPtr = unsigned int (*)(unsigned int)]"
               );
}

Assistant:

static int f(lua_State* L)
        {
            assert(lua_islightuserdata(L, lua_upvalueindex(1)));
            FnPtr fnptr = reinterpret_cast<FnPtr>(lua_touserdata(L, lua_upvalueindex(1)));
            assert(fnptr != 0);
            return Invoke<ReturnType, Params, 1>::run(L, fnptr);
        }